

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_variableNotEqualById_Test::TestBody(Equality_variableNotEqualById_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertionResult local_190 [2];
  AssertHelper local_170 [8];
  Message local_168 [8];
  shared_ptr<libcellml::Entity> local_160;
  bool local_149;
  undefined1 local_148 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_118 [8];
  Message local_110 [8];
  shared_ptr<libcellml::Entity> local_108;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_;
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  VariablePtr v2;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  VariablePtr v1;
  Equality_variableNotEqualById_Test *this_local;
  
  v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"variable",&local_41);
  libcellml::Variable::create((string *)local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,"variable",&local_89);
  libcellml::Variable::create((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"eijei3009",&local_b1);
  libcellml::Entity::setId((string *)peVar3);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"lefisjeij",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::Entity::setId((string *)peVar3);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Variable,void>
            (&local_108,(shared_ptr<libcellml::Variable> *)local_68);
  bVar1 = libcellml::Entity::equals((shared_ptr *)peVar3);
  local_f1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f0,&local_f1,(type *)0x0)
  ;
  std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_108);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar2) {
    testing::Message::Message(local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_f0,"v1->equals(v2)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x4f,pcVar4);
    testing::internal::AssertHelper::operator=(local_118,local_110);
    testing::internal::AssertHelper::~AssertHelper(local_118);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Variable,void>
            (&local_160,(shared_ptr<libcellml::Variable> *)local_20);
  bVar1 = libcellml::Entity::equals((shared_ptr *)peVar3);
  local_149 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_148,&local_149,(type *)0x0);
  std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_160);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar2) {
    testing::Message::Message(local_168);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_190,local_148,"v2->equals(v1)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x50,pcVar4);
    testing::internal::AssertHelper::operator=(local_170,local_168);
    testing::internal::AssertHelper::~AssertHelper(local_170);
    std::__cxx11::string::~string((string *)local_190);
    testing::Message::~Message(local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_68);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_20);
  return;
}

Assistant:

TEST(Equality, variableNotEqualById)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create("variable");
    libcellml::VariablePtr v2 = libcellml::Variable::create("variable");

    v1->setId("eijei3009");
    v2->setId("lefisjeij");

    EXPECT_FALSE(v1->equals(v2));
    EXPECT_FALSE(v2->equals(v1));
}